

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::HttpClient::~HttpClient(HttpClient *this)

{
  ~HttpClient(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

virtual ~HttpClient() = default;